

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

uint64_t child_wid(stagewise_poly *poly,uint64_t wi_atomic,uint64_t wi_general)

{
  uint64_t uVar1;
  uint64_t in_RDX;
  uint64_t in_RSI;
  stagewise_poly *in_RDI;
  uint64_t in_stack_ffffffffffffffb8;
  stagewise_poly *in_stack_ffffffffffffffc0;
  uint64_t local_8;
  
  uVar1 = constant_feat_masked(in_stack_ffffffffffffffc0);
  local_8 = in_RDX;
  if ((in_RSI != uVar1) &&
     (uVar1 = constant_feat_masked(in_stack_ffffffffffffffc0), local_8 = in_RSI, in_RDX != uVar1)) {
    uVar1 = stride_un_shift(in_RDI,in_stack_ffffffffffffffb8);
    stride_un_shift(in_RDI,uVar1);
    stride_shift(in_RDI,uVar1);
    local_8 = wid_mask(in_RDI,uVar1);
  }
  return local_8;
}

Assistant:

inline uint64_t child_wid(const stagewise_poly &poly, uint64_t wi_atomic, uint64_t wi_general)
{
  assert(wi_atomic == wid_mask(poly, wi_atomic));
  assert(wi_general == wid_mask(poly, wi_general));
  assert((wi_atomic & (stride_shift(poly, 1) - 1)) == 0);
  assert((wi_general & (stride_shift(poly, 1) - 1)) == 0);

  if (wi_atomic == constant_feat_masked(poly))
    return wi_general;
  else if (wi_general == constant_feat_masked(poly))
    return wi_atomic;
  else
  {
    // This is basically the "Fowler–Noll–Vo" hash.  Ideally, the hash would be invariant
    // to the monomial, whereas this here is sensitive to the path followed, but whatever.
    // the two main big differences with FNV are: (1) the "*constant" case should also have
    // a big prime (so the default hash shouldn't be identity on small things, and (2) the
    // size should not just be a power of 2, but some big prime.
    return wid_mask(
        poly, stride_shift(poly, stride_un_shift(poly, wi_atomic) ^ (16777619 * stride_un_shift(poly, wi_general))));
  }
}